

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# size.h
# Opt level: O0

Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *
gimage::downscaleImage<unsigned_short>
          (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image,int factor)

{
  ushort uVar1;
  ushort uVar2;
  bool bVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  unsigned_short *puVar7;
  long lVar8;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_RSI;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_RDI;
  int ii_2;
  int kk_2;
  unsigned_short *in_5;
  int n_2;
  work_t v_5;
  long i_1;
  int ii_1;
  int kk_1;
  unsigned_short *in_4;
  int n_1;
  work_t v_4;
  int ii;
  int kk;
  unsigned_short *in_3;
  int n;
  work_t v_3;
  int j_1;
  unsigned_short *in_2;
  work_t v_2;
  int j;
  unsigned_short *in_1;
  work_t v_1;
  unsigned_short *in;
  work_t v;
  long i;
  long k;
  unsigned_short *out;
  int d;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *ret;
  int in_stack_fffffffffffffe0c;
  long in_stack_fffffffffffffe10;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_stack_fffffffffffffe18;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_stack_fffffffffffffe20;
  int local_d0;
  int local_cc;
  unsigned_short *local_c8;
  int local_c0;
  int local_bc;
  long local_b8;
  int local_b0;
  int local_ac;
  unsigned_short *local_a8;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  unsigned_short *local_90;
  int local_84;
  int local_80;
  int local_7c;
  ushort *local_78;
  int local_70;
  int local_6c;
  ushort *local_68;
  int local_5c;
  long local_48;
  long local_40;
  unsigned_short *local_38;
  int local_20;
  int local_18;
  int local_14;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *local_10;
  
  local_18 = 1;
  local_10 = in_RSI;
  piVar5 = std::max<int>(&local_18,&local_14);
  local_14 = *piVar5;
  if (local_14 == 1) {
    Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::Image
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  }
  else {
    Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getWidth(local_10);
    Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getHeight(local_10);
    Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getDepth(local_10);
    Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::Image
              (in_stack_fffffffffffffe20,(long)in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
               in_stack_fffffffffffffe0c);
    for (local_20 = 0;
        iVar4 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getDepth(local_10),
        local_20 < iVar4; local_20 = local_20 + 1) {
      local_38 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getPtr
                           (in_RDI,0,0,local_20);
      for (local_40 = 0; lVar8 = (long)local_14,
          lVar6 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getHeight(local_10),
          local_40 + lVar8 <= lVar6; local_40 = local_14 + local_40) {
        local_48 = 0;
        if (local_14 == 2) {
          for (; lVar6 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getWidth
                                   (local_10), local_48 + 2 <= lVar6; local_48 = local_48 + 2) {
            puVar7 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getPtr
                               (local_10,local_48,local_40,local_20);
            uVar1 = *puVar7;
            uVar2 = puVar7[1];
            lVar6 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getWidth(local_10);
            *local_38 = (unsigned_short)
                        ((ulong)(long)(int)((uint)puVar7[lVar6] + (uint)(puVar7 + lVar6)[1] +
                                            (uint)uVar1 + (uint)uVar2 + 2) / 4);
            local_38 = local_38 + 1;
          }
        }
        else if (local_14 == 3) {
          for (; lVar6 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getWidth
                                   (local_10), local_48 + 3 <= lVar6; local_48 = local_48 + 3) {
            local_5c = 0;
            local_68 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getPtr
                                 (local_10,local_48,local_40,local_20);
            for (local_6c = 0; local_6c < 3; local_6c = local_6c + 1) {
              local_5c = local_5c + (uint)*local_68 + (uint)local_68[1] + (uint)local_68[2];
              lVar6 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getWidth
                                (local_10);
              local_68 = local_68 + lVar6;
            }
            *local_38 = (unsigned_short)((long)(local_5c + 4) / 9);
            local_38 = local_38 + 1;
          }
        }
        else if (local_14 == 4) {
          for (; lVar6 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getWidth
                                   (local_10), local_48 + 4 <= lVar6; local_48 = local_48 + 4) {
            local_70 = 0;
            local_78 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getPtr
                                 (local_10,local_48,local_40,local_20);
            for (local_7c = 0; local_7c < 4; local_7c = local_7c + 1) {
              local_70 = local_70 +
                         (uint)*local_78 + (uint)local_78[1] + (uint)local_78[2] + (uint)local_78[3]
              ;
              lVar6 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getWidth
                                (local_10);
              local_78 = local_78 + lVar6;
            }
            *local_38 = (unsigned_short)((long)(local_70 + 8) / 0x10);
            local_38 = local_38 + 1;
          }
        }
        else {
          for (; lVar8 = (long)local_14,
              lVar6 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getWidth
                                (local_10), local_48 + lVar8 <= lVar6;
              local_48 = local_14 + local_48) {
            local_80 = 0;
            local_84 = 0;
            local_90 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getPtr
                                 (local_10,local_48,local_40,local_20);
            for (local_94 = 0; local_94 < local_14; local_94 = local_94 + 1) {
              for (local_98 = 0; local_98 < local_14; local_98 = local_98 + 1) {
                local_80 = (uint)local_90[local_98] + local_80;
                local_84 = local_84 + 1;
              }
              lVar6 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getWidth
                                (local_10);
              local_90 = local_90 + lVar6;
            }
            *local_38 = (unsigned_short)((local_80 + (local_84 >> 1)) / local_84);
            local_38 = local_38 + 1;
          }
        }
        lVar6 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getWidth(local_10);
        if (local_48 < lVar6) {
          local_9c = 0;
          local_a0 = 0;
          local_a8 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getPtr
                               (local_10,local_48,local_40,local_20);
          for (local_ac = 0; local_ac < local_14; local_ac = local_ac + 1) {
            local_b0 = 0;
            while( true ) {
              bVar3 = false;
              if (local_b0 < local_14) {
                lVar6 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getWidth
                                  (local_10);
                bVar3 = local_48 + local_b0 < lVar6;
              }
              if (!bVar3) break;
              local_9c = (uint)local_a8[local_b0] + local_9c;
              local_a0 = local_a0 + 1;
              local_b0 = local_b0 + 1;
            }
            lVar6 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getWidth(local_10);
            local_a8 = local_a8 + lVar6;
          }
          *local_38 = (unsigned_short)((local_9c + (local_a0 >> 1)) / local_a0);
          local_38 = local_38 + 1;
        }
      }
      lVar6 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getHeight(local_10);
      if (local_40 < lVar6) {
        for (local_b8 = 0;
            lVar6 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getWidth(local_10),
            local_b8 < lVar6; local_b8 = local_14 + local_b8) {
          local_bc = 0;
          local_c0 = 0;
          local_c8 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getPtr
                               (local_10,local_b8,local_40,local_20);
          local_cc = 0;
          while( true ) {
            bVar3 = false;
            if (local_cc < local_14) {
              lVar6 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getHeight
                                (local_10);
              bVar3 = local_40 + local_cc < lVar6;
            }
            if (!bVar3) break;
            local_d0 = 0;
            while( true ) {
              bVar3 = false;
              if (local_d0 < local_14) {
                lVar6 = local_b8 + local_d0;
                lVar8 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getWidth
                                  (local_10);
                bVar3 = lVar6 < lVar8;
              }
              if (!bVar3) break;
              local_bc = (uint)local_c8[local_d0] + local_bc;
              local_c0 = local_c0 + 1;
              local_d0 = local_d0 + 1;
            }
            lVar6 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getWidth(local_10);
            local_c8 = local_c8 + lVar6;
            local_cc = local_cc + 1;
          }
          *local_38 = (unsigned_short)((local_bc + (local_c0 >> 1)) / local_c0);
          local_38 = local_38 + 1;
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

Image<T> downscaleImage(const Image<T> &image, int factor)
{
  factor=std::max(1, factor);

  if (factor == 1)
  {
    return image;
  }

  Image<T> ret((image.getWidth()+factor-1)/factor,
               (image.getHeight()+factor-1)/factor, image.getDepth());

  for (int d=0; d<image.getDepth(); d++)
  {
    T *out=ret.getPtr(0, 0, d);

    long k=0;

    while (k+factor <= image.getHeight())
    {
      long i=0;

      if (factor == 2)
      {
        // speeding up special case of averaging over 2*2 pixels

        while (i+2 <= image.getWidth())
        {
          typename Image<T>::work_t v;

          const T *in=image.getPtr(i, k, d);

          v=*in+in[1];
          in+=image.getWidth();
          v+=*in+in[1];

          *out++=static_cast<typename Image<T>::store_t>((v+2)/4);
          i+=2;
        }
      }
      else if (factor == 3)
      {
        // speeding up special case of averaging over 3*3 pixels

        while (i+3 <= image.getWidth())
        {
          typename Image<T>::work_t v=0;

          const T *in=image.getPtr(i, k, d);

          for (int j=0; j<3; j++)
          {
            v+=*in+in[1]+in[2];
            in+=image.getWidth();
          }

          *out++=static_cast<typename Image<T>::store_t>((v+4)/9);
          i+=3;
        }
      }
      else if (factor == 4)
      {
        // speeding up special case of averaging over 4*4 pixels

        while (i+4 <= image.getWidth())
        {
          typename Image<T>::work_t v=0;

          const T *in=image.getPtr(i, k, d);

          for (int j=0; j<4; j++)
          {
            v+=*in+in[1]+in[2]+in[3];
            in+=image.getWidth();
          }

          *out++=static_cast<typename Image<T>::store_t>((v+8)/16);
          i+=4;
        }
      }
      else
      {
        // average over factor*factor pixels of the input image

        while (i+factor <= image.getWidth())
        {
          typename Image<T>::work_t v=0;
          int n=0;

          const T *in=image.getPtr(i, k, d);

          for (int kk=0; kk<factor; kk++)
          {
            for (int ii=0; ii<factor; ii++)
            {
              v+=in[ii];
              n++;
            }

            in+=image.getWidth();
          }

          *out++=static_cast<typename Image<T>::store_t>((v+(n>>1))/n);
          i+=factor;
        }
      }

      // if there are less than factor pixels left in the image row, then
      // average with boundary check

      if (i < image.getWidth())
      {
        typename Image<T>::work_t v=0;
        int n=0;

        const T *in=image.getPtr(i, k, d);

        for (int kk=0; kk<factor; kk++)
        {
          for (int ii=0; ii<factor && i+ii<image.getWidth(); ii++)
          {
            v+=in[ii];
            n++;
          }

          in+=image.getWidth();
        }

        *out++=static_cast<typename Image<T>::store_t>((v+(n>>1))/n);
      }

      k+=factor;
    }

    // if there are less than factor image rows left in the image, then
    // average with boundary check

    if (k < image.getHeight())
    {
      for (long i=0; i<image.getWidth(); i+=factor)
      {
        typename Image<T>::work_t v=0;
        int n=0;

        const T *in=image.getPtr(i, k, d);

        for (int kk=0; kk<factor && k+kk<image.getHeight(); kk++)
        {
          for (int ii=0; ii<factor && i+ii<image.getWidth(); ii++)
          {
            v+=in[ii];
            n++;
          }

          in+=image.getWidth();
        }

        *out++=static_cast<typename Image<T>::store_t>((v+(n>>1))/n);
      }
    }
  }

  return ret;
}